

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlCrc32.cpp
# Opt level: O1

void __thiscall libebml::EbmlCrc32::EbmlCrc32(EbmlCrc32 *this)

{
  EbmlBinary::EbmlBinary(&this->super_EbmlBinary);
  (this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement =
       (_func_int **)&PTR__EbmlBinary_001ce210;
  this->m_crc = 0xffffffff;
  this->m_crc_final = 0;
  (this->super_EbmlBinary).super_EbmlElement.DefaultSize = 4;
  (this->super_EbmlBinary).super_EbmlElement.Size = 4;
  return;
}

Assistant:

EbmlCrc32::EbmlCrc32()
{
  ResetCRC();
  SetDefaultSize(4);
  m_crc_final = 0;
  SetSize_(4);
  //This EbmlElement has been set
  //  SetValueIsSet();
}